

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O0

bool __thiscall
Ray::cast(Ray *this,Color *c,
         vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_> *objects,
         vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *lights)

{
  bool bVar1;
  Color CVar2;
  int iVar3;
  reference psVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  Material *this_00;
  reference psVar7;
  element_type *peVar8;
  shared_ptr<Ray> sVar9;
  Color local_f4;
  Color local_e4;
  shared_ptr<Obj> local_d0;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined2 local_ae;
  undefined1 local_ac;
  undefined2 local_ab;
  uchar local_a9;
  undefined1 local_a8 [8];
  shared_ptr<Light> light;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *__range3;
  Color diffuseColor;
  tvec4<float,_(glm::precision)0> local_70;
  undefined8 *local_60;
  vec3 *hitpoint;
  shared_ptr<Obj> e;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_> *__range1;
  bool intersected;
  vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *lights_local;
  vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_> *objects_local;
  Color *c_local;
  Ray *this_local;
  undefined8 *puVar6;
  
  __range1._7_1_ = false;
  __end1 = std::vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>::begin(objects)
  ;
  e.super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>::end(objects);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Obj>_*,_std::vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>_>
                                *)&e.super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
    if (!bVar1) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Obj>_*,_std::vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Obj>::shared_ptr((shared_ptr<Obj> *)&hitpoint,psVar4);
    peVar5 = std::__shared_ptr_access<Obj,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Obj,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &hitpoint);
    sVar9 = std::
            make_shared<Ray,glm::tvec4<float,(glm::precision)0>&,glm::tvec4<float,(glm::precision)0>&>
                      (&local_70,&this->start);
    iVar3 = (*peVar5->_vptr_Obj[1])
                      (peVar5,&local_70,
                       sVar9.super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _M_pi);
    puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    std::shared_ptr<Ray>::~shared_ptr((shared_ptr<Ray> *)&local_70);
    local_60 = puVar6;
    if (puVar6 != (undefined8 *)0x0) {
      peVar5 = std::__shared_ptr_access<Obj,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Obj,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &hitpoint);
      this_00 = Obj::getMaterial(peVar5);
      CVar2 = Material::getColor(this_00);
      __range3._1_2_ = CVar2._0_2_;
      __range3._3_1_ = CVar2.b;
      __end3 = std::vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>::begin
                         (lights);
      light.super___shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>::end
                     (lights);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::shared_ptr<Light>_*,_std::vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>_>
                                    *)&light.super___shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
        if (!bVar1) break;
        psVar7 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Light>_*,_std::vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>_>
                 ::operator*(&__end3);
        std::shared_ptr<Light>::shared_ptr((shared_ptr<Light> *)local_a8,psVar7);
        peVar8 = std::__shared_ptr_access<Light,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Light,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_a8);
        local_b8 = *(undefined4 *)(local_60 + 1);
        local_c0 = *local_60;
        std::shared_ptr<Obj>::shared_ptr(&local_d0,(shared_ptr<Obj> *)&hitpoint);
        iVar3 = (**peVar8->_vptr_Light)(local_c0,local_b8,peVar8,&local_d0);
        local_ae = (undefined2)iVar3;
        local_ac = (undefined1)((uint)iVar3 >> 0x10);
        local_e4 = SUB43(iVar3,0);
        CVar2 = Color::operator*((Color *)((long)&__range3 + 1),local_e4);
        local_ab = CVar2._0_2_;
        local_a9 = CVar2.b;
        Color::operator=((Color *)((long)&__range3 + 1),CVar2);
        std::shared_ptr<Obj>::~shared_ptr(&local_d0);
        std::shared_ptr<Light>::~shared_ptr((shared_ptr<Light> *)local_a8);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Light>_*,_std::vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>_>
        ::operator++(&__end3);
      }
      local_f4.b = __range3._3_1_;
      local_f4.r = __range3._1_1_;
      local_f4.g = __range3._2_1_;
      Color::operator=(c,local_f4);
      __range1._7_1_ = true;
    }
    if (local_60 != (undefined8 *)0x0) {
      operator_delete(local_60);
    }
    std::shared_ptr<Obj>::~shared_ptr((shared_ptr<Obj> *)&hitpoint);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Obj>_*,_std::vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool Ray::cast(Color& c, std::vector<std::shared_ptr<Obj>> objects, std::vector<std::shared_ptr<Light>> lights) {
    bool intersected = false;
    for( auto e : objects) {
        glm::vec3* hitpoint = e->intersect(std::make_shared<Ray>(start, direction));
        if (hitpoint != nullptr) {
            //c = e->getMaterial().getColor();
            Color diffuseColor =  e->getMaterial().getColor();
            for(auto light : lights){
                diffuseColor = diffuseColor * light->diffuse(*hitpoint, e);
            }
            c =  diffuseColor;
            intersected = true;
        }
        delete hitpoint;
    }
    return intersected;
}